

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O3

int isobusfs_sendto(int sock,void *data,size_t len,sockaddr_can *addr,
                   isobusfs_buf_log *isobusfs_tx_buffer)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  uint __errnum;
  
  uVar1 = isobusfs_tx_buffer->index;
  *(undefined8 *)isobusfs_tx_buffer->entries[uVar1].data = *data;
  __errnum = 0;
  clock_gettime(0,(timespec *)&isobusfs_tx_buffer->entries[uVar1].ts);
  isobusfs_tx_buffer->index =
       isobusfs_tx_buffer->index + ((isobusfs_tx_buffer->index + 1) / 10) * -10 + 1;
  sVar2 = sendto(sock,data,len,0x40,(sockaddr *)addr,0x18);
  if ((int)sVar2 == -1) {
    piVar3 = __errno_location();
    __errnum = -*piVar3;
    pcVar4 = strerror(__errnum);
    isobusfs_log(LOG_LEVEL_WARN,"failed to send data: %i (%s)",(ulong)__errnum,pcVar4);
  }
  return __errnum;
}

Assistant:

int isobusfs_sendto(int sock, const void *data, size_t len,
		    const struct sockaddr_can *addr,
		    struct isobusfs_buf_log *isobusfs_tx_buffer)
{
	int ret;

	/* store to tx buffer */
	isobufs_store_tx_data(isobusfs_tx_buffer, (uint8_t *)data);

	ret = sendto(sock, data, len, MSG_DONTWAIT,
		     (struct sockaddr *)addr, sizeof(*addr));
	if (ret == -1) {
		ret = -errno;
		pr_warn("failed to send data: %i (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}